

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O1

void __thiscall Start::checkForCreditsAndBetSuperFire10(Start *this,double *credits,uint *bet)

{
  if ((*credits < (double)*bet) && (2.0 <= *credits)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Automatic change bet to min!",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Not Enough Credits for Max Bet!",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    *bet = 2;
  }
  return;
}

Assistant:

void Start::checkForCreditsAndBetSuperFire10(double& credits, unsigned int& bet) {
	if (bet > credits && credits >= 2) {
		std::cout << "Automatic change bet to min!" << std::endl;
		std::cout << "Not Enough Credits for Max Bet!" << std::endl;
		bet = 2;
	}
}